

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

bool __thiscall ON_PolylineCurve::GetSpanVector(ON_PolylineCurve *this,double *s)

{
  int iVar1;
  double *__src;
  int count;
  bool rc;
  double *s_local;
  ON_PolylineCurve *this_local;
  
  iVar1 = PointCount(this);
  if (0 < iVar1) {
    __src = ON_SimpleArray<double>::Array(&this->m_t);
    memcpy(s,__src,(long)iVar1 << 3);
  }
  return 0 < iVar1;
}

Assistant:

bool ON_PolylineCurve::GetSpanVector( // span "knots" 
       double* s // array of length SpanCount() + 1 
       ) const
{
  bool rc = false;
  const int count = PointCount();
  if ( count >= 1 ) 
  {
    memcpy( s, m_t.Array(), count*sizeof(*s) );
    rc = true;
  }
  return rc;
}